

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

bool __thiscall sf::Texture::loadFromImage(Texture *this,Image *image,IntRect *area)

{
  bool bVar1;
  Vector2u VVar2;
  int local_84;
  Uint8 *pUStack_80;
  int i;
  Uint8 *pixels;
  TextureSaver local_68;
  TransientContextLock local_61;
  TextureSaver save;
  int iStack_5c;
  TransientContextLock lock;
  IntRect rectangle;
  uint local_48;
  uint uStack_3c;
  uint uStack_34;
  int height;
  int width;
  IntRect *area_local;
  Image *image_local;
  Texture *this_local;
  
  VVar2 = Image::getSize(image);
  uStack_34 = VVar2.x;
  VVar2 = Image::getSize(image);
  uStack_3c = VVar2.y;
  if (((area->width == 0) || (area->height == 0)) ||
     ((area->left < 1 &&
      (((area->top < 1 && ((int)uStack_34 <= area->width)) && ((int)uStack_3c <= area->height))))))
  {
    VVar2 = Image::getSize(image);
    local_48 = VVar2.x;
    VVar2 = Image::getSize(image);
    rectangle.height = VVar2.y;
    bVar1 = create(this,local_48,rectangle.height);
    if (bVar1) {
      update(this,image);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    save.m_textureBinding = area->left;
    iStack_5c = area->top;
    rectangle.left = area->width;
    rectangle.top = area->height;
    if (save.m_textureBinding < 0) {
      _save = _save & 0xffffffff00000000;
    }
    if ((long)_save < 0) {
      _save = _save & 0xffffffff;
    }
    if ((int)uStack_34 < save.m_textureBinding + rectangle.left) {
      rectangle.left = uStack_34 - save.m_textureBinding;
    }
    if ((int)uStack_3c < iStack_5c + rectangle.top) {
      rectangle.top = uStack_3c - iStack_5c;
    }
    bVar1 = create(this,rectangle.left,rectangle.top);
    if (bVar1) {
      GlResource::TransientContextLock::TransientContextLock(&local_61);
      priv::TextureSaver::TextureSaver(&local_68);
      pUStack_80 = Image::getPixelsPtr(image);
      pUStack_80 = pUStack_80 + (int)((save.m_textureBinding + uStack_34 * iStack_5c) * 4);
      glBindTexture(0xde1,this->m_texture);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x121,"glBindTexture(GL_TEXTURE_2D, m_texture)");
      for (local_84 = 0; local_84 < rectangle.top; local_84 = local_84 + 1) {
        glTexSubImage2D(0xde1,0,0,local_84,rectangle._0_8_ & 0xffffffff,1,0x1908,0x1401,pUStack_80);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x124,
                           "glTexSubImage2D(GL_TEXTURE_2D, 0, 0, i, rectangle.width, 1, GL_RGBA, GL_UNSIGNED_BYTE, pixels)"
                          );
        pUStack_80 = pUStack_80 + (int)(uStack_34 << 2);
      }
      glTexParameteri(0xde1,0x2801,this->m_isSmooth & 1 | 0x2600);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x128,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                        );
      this->m_hasMipmap = false;
      glFlush();
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x12d,"glFlush()");
      this_local._7_1_ = true;
      priv::TextureSaver::~TextureSaver(&local_68);
      GlResource::TransientContextLock::~TransientContextLock(&local_61);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Texture::loadFromImage(const Image& image, const IntRect& area)
{
    // Retrieve the image size
    int width = static_cast<int>(image.getSize().x);
    int height = static_cast<int>(image.getSize().y);

    // Load the entire image if the source area is either empty or contains the whole image
    if (area.width == 0 || (area.height == 0) ||
       ((area.left <= 0) && (area.top <= 0) && (area.width >= width) && (area.height >= height)))
    {
        // Load the entire image
        if (create(image.getSize().x, image.getSize().y))
        {
            update(image);

            return true;
        }
        else
        {
            return false;
        }
    }
    else
    {
        // Load a sub-area of the image

        // Adjust the rectangle to the size of the image
        IntRect rectangle = area;
        if (rectangle.left   < 0) rectangle.left = 0;
        if (rectangle.top    < 0) rectangle.top  = 0;
        if (rectangle.left + rectangle.width > width)  rectangle.width  = width - rectangle.left;
        if (rectangle.top + rectangle.height > height) rectangle.height = height - rectangle.top;

        // Create the texture and upload the pixels
        if (create(rectangle.width, rectangle.height))
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            // Copy the pixels to the texture, row by row
            const Uint8* pixels = image.getPixelsPtr() + 4 * (rectangle.left + (width * rectangle.top));
            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            for (int i = 0; i < rectangle.height; ++i)
            {
                glCheck(glTexSubImage2D(GL_TEXTURE_2D, 0, 0, i, rectangle.width, 1, GL_RGBA, GL_UNSIGNED_BYTE, pixels));
                pixels += 4 * width;
            }

            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
            m_hasMipmap = false;

            // Force an OpenGL flush, so that the texture will appear updated
            // in all contexts immediately (solves problems in multi-threaded apps)
            glCheck(glFlush());

            return true;
        }
        else
        {
            return false;
        }
    }
}